

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void Assimp::Write(JSONWriter *out,aiTexture *ai,bool is_elem)

{
  undefined1 *puVar1;
  pointer pcVar2;
  aiTexel *paVar3;
  size_t sVar4;
  stringstream *psVar5;
  uint uVar6;
  uint uVar7;
  char local_45d;
  uint local_45c;
  long *local_458;
  ulong local_450;
  long local_448 [2];
  undefined1 local_438 [1032];
  
  JSONWriter::StartObj(out,is_elem);
  pcVar2 = local_438 + 0x10;
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"width","");
  JSONWriter::Key(out,(string *)local_438);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  puVar1 = &out->field_0x58;
  std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
  local_438[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,local_438,1);
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"height","");
  JSONWriter::Key(out,(string *)local_438);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
  local_438[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,local_438,1);
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"formathint","");
  JSONWriter::Key(out,(string *)local_438);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  local_458 = local_448;
  sVar4 = strlen(ai->achFormatHint);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,ai->achFormatHint,ai->achFormatHint + sVar4);
  sVar4 = 0x3ff;
  if ((local_450 & 0xfffffc00) == 0) {
    sVar4 = local_450 & 0xffffffff;
  }
  local_438._0_4_ = (int)sVar4;
  memcpy(local_438 + 4,local_458,sVar4);
  local_438[sVar4 + 4] = 0;
  psVar5 = JSONWriter::LiteralToString(out,&out->buff,(aiString *)local_438);
  local_45d = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar5 + 0x10),&local_45d,1);
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"data","");
  JSONWriter::Key(out,(string *)local_438);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (ai->mHeight == 0) {
    JSONWriter::SimpleValue(out,ai->pcData,(ulong)ai->mWidth);
  }
  else {
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back((char)out + '\b');
    if (ai->mHeight != 0) {
      uVar7 = 0;
      do {
        local_45c = uVar7;
        JSONWriter::StartArray(out,true);
        uVar7 = ai->mWidth;
        if (uVar7 != 0) {
          uVar6 = 0;
          do {
            paVar3 = ai->pcData;
            uVar7 = uVar7 * local_45c + uVar6;
            JSONWriter::StartArray(out,true);
            local_438._0_4_ = (uint)paVar3[uVar7].r;
            JSONWriter::Element<unsigned_int>(out,(uint *)local_438);
            local_438._0_4_ = ZEXT14(paVar3[uVar7].g);
            JSONWriter::Element<unsigned_int>(out,(uint *)local_438);
            local_438._0_4_ = ZEXT14(paVar3[uVar7].b);
            JSONWriter::Element<unsigned_int>(out,(uint *)local_438);
            local_438._1_3_ = 0;
            local_438[0] = paVar3[uVar7].a;
            JSONWriter::Element<unsigned_int>(out,(uint *)local_438);
            JSONWriter::EndArray(out);
            uVar6 = uVar6 + 1;
            uVar7 = ai->mWidth;
          } while (uVar6 < uVar7);
        }
        JSONWriter::EndArray(out);
        uVar7 = local_45c + 1;
      } while (uVar7 < ai->mHeight);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiTexture& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("width");
    out.SimpleValue(ai.mWidth);

    out.Key("height");
    out.SimpleValue(ai.mHeight);

    out.Key("formathint");
    out.SimpleValue(aiString(ai.achFormatHint));

    out.Key("data");
    if (!ai.mHeight) {
        out.SimpleValue(ai.pcData, ai.mWidth);
    }
    else {
        out.StartArray();
        for (unsigned int y = 0; y < ai.mHeight; ++y) {
            out.StartArray(true);
            for (unsigned int x = 0; x < ai.mWidth; ++x) {
                const aiTexel& tx = ai.pcData[y*ai.mWidth + x];
                out.StartArray(true);
                out.Element(static_cast<unsigned int>(tx.r));
                out.Element(static_cast<unsigned int>(tx.g));
                out.Element(static_cast<unsigned int>(tx.b));
                out.Element(static_cast<unsigned int>(tx.a));
                out.EndArray();
            }
            out.EndArray();
        }
        out.EndArray();
    }

    out.EndObj();
}